

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Players.cpp
# Opt level: O1

void Handlers::Players_List(EOClient *client,PacketReader *reader)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  Character *pCVar5;
  bool bVar6;
  PacketAction PVar7;
  int iVar8;
  int iVar9;
  iterator __begin1;
  mapped_type *pmVar10;
  long *plVar11;
  iterator __end1;
  long lVar12;
  size_type *psVar13;
  int iVar14;
  char cVar15;
  Character *pCVar16;
  ulong uVar17;
  byte bVar18;
  _List_node_base *p_Var19;
  PacketBuilder reply;
  string name_suffix;
  string hidden_admin_suffix;
  undefined1 local_118 [48];
  Character *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  _List_node_base *local_a0;
  Character *local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  key_type local_50;
  
  if (client->player == (Player *)0x0) {
    pCVar16 = (Character *)0x0;
  }
  else {
    pCVar16 = client->player->character;
  }
  p_Var4 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  pcVar1 = local_118 + 0x10;
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"seehide","");
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(p_Var4 + 0x1f),(key_type *)local_118);
  iVar8 = util::variant::GetInt(pmVar10);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  p_Var4 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"cmdprotect","");
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(p_Var4 + 0x1f),(key_type *)local_118);
  iVar9 = util::variant::GetInt(pmVar10);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  p_Var4 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"SLN","");
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&p_Var4[0x19]._M_prev,(key_type *)local_118);
  bVar6 = util::variant::GetBool(pmVar10);
  if (bVar6) {
    bVar18 = 0;
  }
  else {
    p_Var4 = (client->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AllowStats","");
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var4[0x19]._M_prev,&local_50);
    bVar6 = util::variant::GetBool(pmVar10);
    bVar18 = ~bVar6 & pCVar16 == (Character *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (bVar18 == 0) {
    p_Var4 = (client->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    p_Var19 = p_Var4[0x49]._M_prev;
    p_Var4 = p_Var4[0x4a]._M_next;
    uVar17 = (ulong)((long)p_Var4 - (long)p_Var19) >> 3;
    iVar14 = (int)uVar17;
    for (; p_Var4 != p_Var19; p_Var19 = (_List_node_base *)&p_Var19->_M_prev) {
      pCVar5 = (Character *)p_Var19->_M_next;
      if ((pCVar5->hidden & 2) != 0) {
        iVar14 = -1;
        if (pCVar16 != (Character *)0x0) {
          if (pCVar16 == pCVar5) {
            iVar14 = 0;
          }
          else if (iVar8 <= (int)(uint)pCVar16->admin) {
            iVar14 = -(uint)(pCVar16->admin <= pCVar5->admin && iVar9 <= (int)(uint)pCVar5->admin);
          }
        }
        uVar17 = (ulong)(uint)((int)uVar17 + iVar14);
      }
      iVar14 = (int)uVar17;
    }
    PVar7 = PacketReader::Action(reader);
    p_Var4 = (client->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    local_118._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"hidden_admin_suffix","");
    I18N::Format<>(&local_70,(I18N *)(p_Var4 + 0x49),(string *)local_118);
    if ((pointer)local_118._0_8_ != pcVar1) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    lVar12 = 0xd;
    if (PVar7 != PACKET_LIST) {
      lVar12 = local_70._M_string_length + 0x24;
    }
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_118,PACKET_F_INIT,PACKET_A_INIT,lVar12 * iVar14 + 4);
    local_e8 = pCVar16;
    PacketBuilder::AddChar((PacketBuilder *)local_118,(uint)(PVar7 == PACKET_LIST) * 2 + 8);
    PacketBuilder::AddShort((PacketBuilder *)local_118,iVar14);
    PacketBuilder::AddByte((PacketBuilder *)local_118,0xff);
    p_Var4 = (client->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    p_Var19 = p_Var4[0x49]._M_prev;
    local_a0 = p_Var4[0x4a]._M_next;
    if (p_Var19 != local_a0) {
      paVar2 = &local_e0.field_2;
      do {
        pCVar16 = (Character *)p_Var19->_M_next;
        uVar3 = pCVar16->hidden;
        local_c0 = &local_b0;
        local_b8 = 0;
        local_b0 = 0;
        if ((uVar3 & 2) == 0) {
LAB_00164c98:
          local_98 = pCVar16;
          (*(pCVar16->super_Command_Source)._vptr_Command_Source[2])(local_90);
          plVar11 = (long *)std::__cxx11::string::_M_append((char *)local_90,(ulong)local_c0);
          psVar13 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_e0.field_2._M_allocated_capacity = *psVar13;
            local_e0.field_2._8_8_ = plVar11[3];
            local_e0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar13;
            local_e0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_e0._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          PacketBuilder::AddBreakString((PacketBuilder *)local_118,&local_e0,0xff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          pCVar16 = local_98;
          if (PVar7 == PACKET_LIST) {
            (*(local_98->super_Command_Source)._vptr_Command_Source[2])(&local_e0,local_98);
            PacketBuilder::AddBreakString((PacketBuilder *)local_118,&local_e0,0xff);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            PacketBuilder::AddBreakString((PacketBuilder *)local_118,&local_98->title,0xff);
            PacketBuilder::AddChar((PacketBuilder *)local_118,0);
            if ((pCVar16->bot != true) || (iVar14 = 0x14, local_e8 != (Character *)0x0)) {
              cVar15 = (char)((uVar3 & 8) >> 3);
              if (pCVar16->admin < ADMIN_HGM || cVar15 != '\0') {
                if (pCVar16->admin == ADMIN_PLAYER || cVar15 != '\0') {
                  iVar14 = 6;
                  if (pCVar16->party == (Party *)0x0) {
                    iVar14 = 0;
                  }
                }
                else {
                  iVar14 = (uint)(pCVar16->party != (Party *)0x0) * 5 + 4;
                }
              }
              else {
                iVar14 = (uint)(pCVar16->party != (Party *)0x0) * 5 + 5;
              }
            }
            PacketBuilder::AddChar((PacketBuilder *)local_118,iVar14);
            PacketBuilder::AddChar((PacketBuilder *)local_118,(uint)pCVar16->clas);
            Character::PaddedGuildTag_abi_cxx11_(&local_e0,pCVar16);
            PacketBuilder::AddString((PacketBuilder *)local_118,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            PacketBuilder::AddByte((PacketBuilder *)local_118,0xff);
          }
        }
        else if ((local_e8 != (Character *)0x0) &&
                ((local_e8 == pCVar16 ||
                 ((iVar8 <= (int)(uint)local_e8->admin &&
                  ((pCVar16->admin < local_e8->admin || ((int)(uint)pCVar16->admin < iVar9)))))))) {
          std::operator+(&local_e0," ",&local_70);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00164c98;
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
        }
        p_Var19 = (_List_node_base *)&p_Var19->_M_prev;
      } while (p_Var19 != local_a0);
    }
    EOClient::Send(client,(PacketBuilder *)local_118);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Players_List(EOClient *client, PacketReader &reader)
{
	Player* from_player = client->player;
	Character* from_character = from_player ? from_player->character : nullptr;
	int seehide = client->server()->world->admin_config["seehide"];
	int cmdprotect = client->server()->world->admin_config["cmdprotect"];

	auto really_hidden = [&](const Character* character)
	{
		return !(from_character && (
		       from_character == character
		    || (from_character->admin >= seehide && character->admin < cmdprotect)
		    || (from_character->admin >= seehide && character->admin >= cmdprotect && from_character->admin > character->admin)
		));
	};

	if (!client->server()->world->config["SLN"] && !client->server()->world->config["AllowStats"] && !from_character)
	{
		return;
	}

	int online = client->server()->world->characters.size();

	UTIL_FOREACH(client->server()->world->characters, character)
	{
		bool hide_online = character->IsHideOnline();

		if (hide_online && really_hidden(character))
			--online;
	}

	bool is_friends_list = (reader.Action() == PACKET_LIST);
	std::string hidden_admin_suffix = client->server()->world->i18n.Format("hidden_admin_suffix");

	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 4 + online * (is_friends_list ? 13 : (36 + hidden_admin_suffix.length())));
	reply.AddChar(is_friends_list ? INIT_FRIEND_LIST_PLAYERS : INIT_PLAYERS);
	reply.AddShort(online);
	reply.AddByte(255);
	UTIL_FOREACH(client->server()->world->characters, character)
	{
		bool hide_online = character->IsHideOnline();
		bool hide_admin = character->IsHideAdmin();

		std::string name_suffix;

		if (hide_online && really_hidden(character))
			continue;

		if (hide_online)
			name_suffix = " " + hidden_admin_suffix;

		reply.AddBreakString(character->SourceName() + name_suffix);

		// Full information is not sent for friends list requests
		if (!is_friends_list)
		{
			reply.AddBreakString(character->title);
			reply.AddChar(0); // ?
			if (character->bot && !from_character)
			{
				reply.AddChar(ICON_SLN_BOT);
			}
			else if (character->admin >= ADMIN_HGM && !hide_admin)
			{
				if (character->party)
				{
					reply.AddChar(ICON_HGM_PARTY);
				}
				else
				{
					reply.AddChar(ICON_HGM);
				}
			}
			else if (character->admin >= ADMIN_GUIDE && !hide_admin)
			{
				if (character->party)
				{
					reply.AddChar(ICON_GM_PARTY);
				}
				else
				{
					reply.AddChar(ICON_GM);
				}
			}
			else
			{
				if (character->party)
				{
					reply.AddChar(ICON_PARTY);
				}
				else
				{
					reply.AddChar(ICON_NORMAL);
				}
			}
			reply.AddChar(character->clas);
			reply.AddString(character->PaddedGuildTag());
			reply.AddByte(255);
		}
		else
		{
			reply.AddBreakString(character->SourceName());
		}
	}

	client->Send(reply);
}